

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cTextureFilterMinmaxTests.cpp
# Opt level: O1

void __thiscall
gl4cts::TextureFilterMinmaxUtils::Texture2DArray::generate
          (Texture2DArray *this,RenderContext *context,IVec3 *size,GLenum format,GLenum type,
          bool generateMipmaps)

{
  MovePtr<glu::Texture2DArray,_de::DefaultDeleter<glu::Texture2DArray>_> *this_00;
  long lVar1;
  int iVar2;
  deUint32 dVar3;
  undefined4 extraout_var;
  Texture2DArray *this_01;
  undefined1 local_58 [16];
  long local_48;
  Vec4 local_40;
  
  iVar2 = (*context->_vptr_RenderContext[3])(context);
  local_48 = CONCAT44(extraout_var,iVar2);
  this_01 = (Texture2DArray *)operator_new(0x70);
  glu::Texture2DArray::Texture2DArray(this_01,context,format,type,size->m_data[0],size->m_data[1],2)
  ;
  local_58._0_8_ = (Texture2DArray *)0x0;
  this_00 = &this->m_texture;
  if ((this->m_texture).
      super_UniqueBase<glu::Texture2DArray,_de::DefaultDeleter<glu::Texture2DArray>_>.m_data.ptr !=
      this_01) {
    de::details::UniqueBase<glu::Texture2DArray,_de::DefaultDeleter<glu::Texture2DArray>_>::reset
              (&this_00->
                super_UniqueBase<glu::Texture2DArray,_de::DefaultDeleter<glu::Texture2DArray>_>);
    (this_00->super_UniqueBase<glu::Texture2DArray,_de::DefaultDeleter<glu::Texture2DArray>_>).
    m_data.ptr = this_01;
  }
  de::details::UniqueBase<glu::Texture2DArray,_de::DefaultDeleter<glu::Texture2DArray>_>::reset
            ((UniqueBase<glu::Texture2DArray,_de::DefaultDeleter<glu::Texture2DArray>_> *)local_58);
  tcu::Texture2DArray::allocLevel
            (&((this_00->
               super_UniqueBase<glu::Texture2DArray,_de::DefaultDeleter<glu::Texture2DArray>_>).
               m_data.ptr)->m_refTexture,0);
  tcu::Texture2DArray::allocLevel
            (&((this_00->
               super_UniqueBase<glu::Texture2DArray,_de::DefaultDeleter<glu::Texture2DArray>_>).
               m_data.ptr)->m_refTexture,1);
  lVar1 = local_48;
  dVar3 = (**(code **)(local_48 + 0x800))();
  glu::checkError(dVar3,"glu::Texture2DArray error occurred",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cTextureFilterMinmaxTests.cpp"
                  ,0x16f);
  local_58._0_8_ = &DAT_3f8000003f800000;
  local_58._8_8_ = &DAT_3f8000003f800000;
  local_40.m_data[0] = 0.0;
  local_40.m_data[1] = 0.0;
  local_40.m_data[2] = 0.0;
  local_40.m_data[3] = 1.0;
  tcu::fillWithGrid((((this_00->
                      super_UniqueBase<glu::Texture2DArray,_de::DefaultDeleter<glu::Texture2DArray>_>
                      ).m_data.ptr)->m_refTexture).super_TextureLevelPyramid.m_access.
                    super__Vector_base<tcu::PixelBufferAccess,_std::allocator<tcu::PixelBufferAccess>_>
                    ._M_impl.super__Vector_impl_data._M_start,4,(Vec4 *)local_58,&local_40);
  dVar3 = (**(code **)(lVar1 + 0x800))();
  glu::checkError(dVar3,"glu::Texture2DArray error occurred",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cTextureFilterMinmaxTests.cpp"
                  ,0x173);
  local_58._0_8_ = (Texture2DArray *)0x3f80000000000000;
  local_58._8_8_ = &DAT_3f8000003f800000;
  local_40.m_data[0] = 1.0;
  local_40.m_data[1] = 0.0;
  local_40.m_data[2] = 0.0;
  local_40.m_data[3] = 1.0;
  tcu::fillWithGrid((PixelBufferAccess *)
                    ((long)(((this_00->
                             super_UniqueBase<glu::Texture2DArray,_de::DefaultDeleter<glu::Texture2DArray>_>
                             ).m_data.ptr)->m_refTexture).super_TextureLevelPyramid.m_access.
                           super__Vector_base<tcu::PixelBufferAccess,_std::allocator<tcu::PixelBufferAccess>_>
                           ._M_impl.super__Vector_impl_data._M_start + 0x28),4,(Vec4 *)local_58,
                    &local_40);
  dVar3 = (**(code **)(lVar1 + 0x800))();
  glu::checkError(dVar3,"glu::Texture2DArray error occurred",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cTextureFilterMinmaxTests.cpp"
                  ,0x177);
  glu::Texture2DArray::upload
            ((this_00->
             super_UniqueBase<glu::Texture2DArray,_de::DefaultDeleter<glu::Texture2DArray>_>).m_data
             .ptr);
  dVar3 = (**(code **)(lVar1 + 0x800))();
  glu::checkError(dVar3,"glu::Texture2DArray error occurred",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cTextureFilterMinmaxTests.cpp"
                  ,0x17a);
  (**(code **)(lVar1 + 8))(0x84c0);
  return;
}

Assistant:

void TextureFilterMinmaxUtils::Texture2DArray::generate(const glu::RenderContext& context, tcu::IVec3 size,
														glw::GLenum format, glw::GLenum type, bool generateMipmaps)
{
	DE_UNREF(generateMipmaps);

	const glw::Functions& gl = context.getFunctions();

	m_texture = de::MovePtr<glu::Texture2DArray>(new glu::Texture2DArray(context, format, type, size.x(), size.y(), 2));

	m_texture->getRefTexture().allocLevel(0);
	m_texture->getRefTexture().allocLevel(1);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glu::Texture2DArray error occurred");

	tcu::fillWithGrid(m_texture->getRefTexture().getLevel(0), 4, tcu::Vec4(1.0f, 1.0f, 1.0f, 1.0f),
					  tcu::Vec4(0.0f, 0.0f, 0.0f, 1.0f));
	GLU_EXPECT_NO_ERROR(gl.getError(), "glu::Texture2DArray error occurred");

	tcu::fillWithGrid(m_texture->getRefTexture().getLevel(1), 4, tcu::Vec4(0.0f, 1.0f, 1.0f, 1.0f),
					  tcu::Vec4(1.0f, 0.0f, 0.0f, 1.0f));
	GLU_EXPECT_NO_ERROR(gl.getError(), "glu::Texture2DArray error occurred");

	m_texture->upload();
	GLU_EXPECT_NO_ERROR(gl.getError(), "glu::Texture2DArray error occurred");

	gl.activeTexture(GL_TEXTURE0);
}